

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# migrate.cpp
# Opt level: O3

Status __thiscall
wallet::BerkeleyROCursor::Next(BerkeleyROCursor *this,DataStream *ssKey,DataStream *ssValue)

{
  long lVar1;
  Status SVar2;
  _Base_ptr p_Var3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  p_Var3 = (this->m_cursor)._M_node;
  if (p_Var3 == (this->m_cursor_end)._M_node) {
    SVar2 = DONE;
  }
  else {
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
              ((vector<std::byte,zero_after_free_allocator<std::byte>> *)ssKey,
               (ssKey->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
               _M_impl.super__Vector_impl_data._M_finish,*(undefined8 *)(p_Var3 + 1),
               p_Var3[1]._M_parent);
    p_Var3 = (this->m_cursor)._M_node;
    std::vector<std::byte,zero_after_free_allocator<std::byte>>::_M_range_insert<std::byte_const*>
              ((vector<std::byte,zero_after_free_allocator<std::byte>> *)ssValue,
               (ssValue->vch).super__Vector_base<std::byte,_zero_after_free_allocator<std::byte>_>.
               _M_impl.super__Vector_impl_data._M_finish,p_Var3[1]._M_right,
               *(undefined8 *)(p_Var3 + 2));
    p_Var3 = (_Base_ptr)std::_Rb_tree_increment((_Rb_tree_node_base *)(this->m_cursor)._M_node);
    (this->m_cursor)._M_node = p_Var3;
    SVar2 = MORE;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return SVar2;
  }
  __stack_chk_fail();
}

Assistant:

DatabaseCursor::Status BerkeleyROCursor::Next(DataStream& ssKey, DataStream& ssValue)
{
    if (m_cursor == m_cursor_end) {
        return DatabaseCursor::Status::DONE;
    }
    ssKey.write(Span(m_cursor->first));
    ssValue.write(Span(m_cursor->second));
    m_cursor++;
    return DatabaseCursor::Status::MORE;
}